

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O1

void * __thiscall
BitSetImplement<std::bitset<128UL>,_KDefectiveSimple>::setUnion
          (BitSetImplement<std::bitset<128UL>,_KDefectiveSimple> *this,void *A,void *B)

{
  ulong *puVar1;
  size_t __i;
  long lVar2;
  bitset<128UL> __result;
  ulong local_28 [3];
  
  puVar1 = (ulong *)operator_new(0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_28[0] = *A;
  local_28[1] = *(ulong *)((long)A + 8);
  lVar2 = 0;
  do {
    local_28[lVar2] = local_28[lVar2] | *(ulong *)((long)B + lVar2 * 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  *puVar1 = local_28[0];
  puVar1[1] = local_28[1];
  return puVar1;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setUnion(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) | (*__B__);
	return __C__;
}